

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O1

void xPredIntraAngAdi_XY_16(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  pel first_line [192];
  undefined1 auStack_f8 [200];
  
  uVar5 = iHeight / 2;
  uVar6 = (uVar5 + iWidth) - 1;
  uVar1 = uVar5 - 1;
  lVar8 = (long)(int)(uVar5 + iWidth + 0xe & 0xfffffff0);
  lVar7 = (long)pSrc - (long)(iHeight + -2);
  if ((int)uVar1 < 1) {
    uVar9 = 0;
  }
  else {
    lVar10 = 0;
    uVar9 = 0;
    do {
      bVar2 = *(byte *)(lVar7 + uVar9 * 2);
      bVar3 = *(byte *)(lVar7 + 1 + uVar9 * 2);
      auStack_f8[uVar9] =
           (char)((uint)bVar2 + (uint)bVar3 * 2 + (uint)*(byte *)(lVar7 + 2 + uVar9 * 2) + 2 >> 2);
      auStack_f8[uVar9 + lVar8] =
           (char)((uint)*(byte *)(lVar7 + -1 + uVar9 * 2) + (uint)bVar3 + (uint)bVar2 * 2 + 2 >> 2);
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + -2;
    } while (uVar1 != uVar9);
    lVar7 = lVar7 - lVar10;
  }
  if ((int)uVar9 < (int)uVar6) {
    uVar9 = uVar9 & 0xffffffff;
    lVar10 = 0;
    do {
      bVar2 = *(byte *)(lVar7 + -1 + lVar10);
      bVar3 = *(byte *)(lVar7 + lVar10);
      bVar4 = *(byte *)(lVar7 + 1 + lVar10);
      auStack_f8[lVar10 + uVar9] =
           (char)((uint)*(byte *)(lVar7 + 2 + lVar10) + (uint)bVar2 +
                  ((uint)bVar4 + (uint)bVar3) * 3 + 4 >> 3);
      auStack_f8[lVar10 + lVar8 + uVar9] =
           (char)((uint)bVar2 + (uint)bVar3 * 2 + (uint)bVar4 + 2 >> 2);
      lVar10 = lVar10 + 1;
    } while (uVar6 - uVar9 != lVar10);
  }
  if (1 < iHeight) {
    lVar7 = 0;
    do {
      memcpy(dst,auStack_f8 + lVar7 + (int)uVar1,(long)iWidth);
      memcpy(dst + i_dst,auStack_f8 + lVar7 + (int)uVar1 + lVar8,(long)iWidth);
      dst = dst + i_dst * 2;
      lVar7 = lVar7 + -1;
    } while (-lVar7 != (ulong)uVar5);
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_XY_16(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    ALIGNED_16(pel first_line[2 * (64 + 32)]);
    int line_size = iWidth + iHeight / 2 - 1;
    int left_size = line_size - iWidth;
    int aligned_line_size = ((line_size + 15) >> 4) << 4;
    pel *pfirst[2] = { first_line, first_line + aligned_line_size };

    int i;

    pSrc -= iHeight - 2;

    for (i = 0; i < left_size; i++, pSrc += 2) {
        pfirst[0][i] = (pSrc[0] + pSrc[1] * 2 + pSrc[2] + 2) >> 2;
        pfirst[1][i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
    }

    for (; i < line_size; i++, pSrc++) {
        pfirst[0][i] = (pSrc[-1] + (pSrc[0] + pSrc[1]) * 3 + pSrc[2] + 4) >> 3;
        pfirst[1][i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
    }

    pfirst[0] += left_size;
    pfirst[1] += left_size;

    iHeight /= 2;

    for (i = 0; i < iHeight; i++) {
        memcpy(dst, pfirst[0] - i, iWidth * sizeof(pel));
        memcpy(dst + i_dst, pfirst[1] - i, iWidth * sizeof(pel));
        dst += 2 * i_dst;
    }
}